

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow_p.h
# Opt level: O1

void __thiscall
QMdi::ControlElement<QMdi::ControlLabel>::~ControlElement(ControlElement<QMdi::ControlLabel> *this)

{
  Data *pDVar1;
  
  *(undefined ***)&(this->super_ControlLabel).super_QWidget = &PTR_metaObject_00804af0;
  *(undefined ***)&(this->super_ControlLabel).super_QWidget.super_QPaintDevice =
       &PTR__ControlElement_00804ca0;
  pDVar1 = (this->mdiChild).wp.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar1 = *(int *)pDVar1 + -1;
    UNLOCK();
    if ((*(int *)pDVar1 == 0) && (pDVar1 = (this->mdiChild).wp.d, pDVar1 != (Data *)0x0)) {
      operator_delete(pDVar1);
    }
  }
  *(undefined ***)&(this->super_ControlLabel).super_QWidget = &PTR_metaObject_00803fe8;
  *(undefined ***)&(this->super_ControlLabel).super_QWidget.super_QPaintDevice =
       &PTR__ControlLabel_00804198;
  QPixmap::~QPixmap(&(this->super_ControlLabel).label);
  QWidget::~QWidget((QWidget *)this);
  operator_delete(this,0x58);
  return;
}

Assistant:

ControlElement(QMdiSubWindow *child) : T(nullptr)
    {
        Q_ASSERT(child);
        mdiChild = child;
    }